

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O1

Production * new_internal_production(Grammar *g,Production *p)

{
  byte bVar1;
  uint uVar2;
  Production **ppPVar3;
  Production *pPVar4;
  bool bVar5;
  size_t sVar6;
  char *__s;
  Production *pPVar7;
  uint uVar8;
  ulong uVar9;
  Production *pPVar10;
  char *__s_00;
  
  if (p == (Production *)0x0) {
    __s_00 = " _synthetic";
  }
  else {
    __s_00 = p->name;
  }
  sVar6 = strlen(__s_00);
  __s = (char *)malloc((long)((sVar6 << 0x20) + 0x1500000000) >> 0x20);
  if (__s == (char *)0x0) {
    pPVar7 = (Production *)0x0;
    d_fail("could not allocate enough memory for a new_internal_production");
  }
  else {
    snprintf(__s,(long)((sVar6 << 0x20) + 0x1400000000) >> 0x20,"%s__%d",__s_00,
             (ulong)(g->productions).n);
    pPVar7 = new_production(g,__s);
    bVar1 = pPVar7->field_0x3c;
    pPVar7->field_0x3c = bVar1 & 0xe3 | 4;
    if (p == (Production *)0x0) {
      pPVar7->field_0x3c = bVar1 & 0xe2 | 4;
    }
    else {
      pPVar7->field_0x3c = bVar1 & 0xe2 | 4 | p->field_0x3c & 1;
      uVar2 = (g->productions).n;
      if (uVar2 != 0) {
        bVar5 = false;
        uVar9 = 0;
        pPVar10 = (Production *)0x0;
        do {
          uVar8 = (uint)uVar9;
          if (bVar5) {
            ppPVar3 = (g->productions).v;
            pPVar4 = ppPVar3[uVar9];
            ppPVar3[uVar9] = pPVar10;
            bVar5 = true;
            pPVar10 = pPVar4;
          }
          else {
            ppPVar3 = (g->productions).v;
            bVar5 = false;
            if (ppPVar3[uVar9] == p) {
              uVar8 = uVar8 + 1;
              pPVar10 = ppPVar3[uVar8];
              ppPVar3[uVar8] = pPVar7;
              bVar5 = true;
            }
          }
          uVar9 = (ulong)(uVar8 + 1);
        } while (uVar8 + 1 < uVar2);
      }
    }
  }
  return pPVar7;
}

Assistant:

Production *new_internal_production(Grammar *g, Production *p) {
  char *n = p ? p->name : " _synthetic";
  int maxLen = strlen(n) + 21;
  char *name = MALLOC(maxLen);
  if (name == NULL) {
    d_fail("could not allocate enough memory for a new_internal_production");
    return NULL;
  }
  maxLen--;
  Production *pp = NULL, *tp = NULL, *ttp;
  uint i, found = 0;
  snprintf(name, maxLen, "%s__%d", n, g->productions.n);
  pp = new_production(g, name);
  pp->internal = INTERNAL_HIDDEN;
  pp->regex = p ? p->regex : 0;
  if (p) {
    for (i = 0; i < g->productions.n; i++) {
      if (found) {
        ttp = g->productions.v[i];
        g->productions.v[i] = tp;
        tp = ttp;
      } else if (p == g->productions.v[i]) {
        found = 1;
        tp = g->productions.v[i + 1];
        g->productions.v[i + 1] = pp;
        i++;
      }
    }
  }
  return pp;
}